

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::unrecognizedMoleculeProperty(SelectionEvaluator *this,int param_1)

{
  long *local_30 [2];
  long local_20 [2];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,"unrecognized molecule property","");
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_30[0]);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void unrecognizedMoleculeProperty(int) {
      evalError("unrecognized molecule property");
    }